

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O2

optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *
TryParseHex<std::byte>
          (optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *__return_storage_ptr__,
          string_view str)

{
  byte c;
  byte bVar1;
  byte bVar2;
  bool bVar3;
  byte *pbVar4;
  byte *pbVar5;
  long in_FS_OFFSET;
  vector<std::byte,_std::allocator<std::byte>_> vch;
  byte local_59;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_58;
  long local_38;
  
  pbVar4 = (byte *)str._M_str;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::byte,_std::allocator<std::byte>_>::reserve
            ((vector<std::byte,_std::allocator<std::byte>_> *)&local_58,str._M_len >> 1);
  pbVar5 = pbVar4 + str._M_len;
LAB_0036fcd7:
  do {
    if (pbVar4 == pbVar5) {
      *(pointer *)
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<std::byte,_std::allocator<std::byte>_>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::vector<std::byte,_std::allocator<std::byte>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>.
        _M_payload._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl =
           local_58._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<std::byte,_std::allocator<std::byte>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<std::byte,_std::allocator<std::byte>_>,_true,_false,_false>
               .super__Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>.
               _M_payload._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
       + 8) = local_58._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<std::byte,_std::allocator<std::byte>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<std::byte,_std::allocator<std::byte>_>,_true,_false,_false>
               .super__Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>.
               _M_payload._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
       + 0x10) = local_58._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar3 = true;
LAB_0036fd58:
      (__return_storage_ptr__->
      super__Optional_base<std::vector<std::byte,_std::allocator<std::byte>_>,_false,_false>).
      _M_payload.
      super__Optional_payload<std::vector<std::byte,_std::allocator<std::byte>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>._M_engaged
           = bVar3;
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    c = *pbVar4;
    if (((ulong)c < 0x21) && ((0x100003e00U >> ((ulong)c & 0x3f) & 1) != 0)) {
      pbVar4 = pbVar4 + 1;
      goto LAB_0036fcd7;
    }
    bVar1 = HexDigit(c);
    if (pbVar4 + 1 == pbVar5) {
LAB_0036fd56:
      bVar3 = false;
      goto LAB_0036fd58;
    }
    bVar2 = HexDigit(pbVar4[1]);
    if ((char)(bVar2 | bVar1) < '\0') goto LAB_0036fd56;
    local_59 = bVar2 | bVar1 << 4;
    std::vector<std::byte,_std::allocator<std::byte>_>::emplace_back<std::byte>
              ((vector<std::byte,_std::allocator<std::byte>_> *)&local_58,&local_59);
    pbVar4 = pbVar4 + 2;
  } while( true );
}

Assistant:

std::optional<std::vector<Byte>> TryParseHex(std::string_view str)
{
    std::vector<Byte> vch;
    vch.reserve(str.size() / 2); // two hex characters form a single byte

    auto it = str.begin();
    while (it != str.end()) {
        if (IsSpace(*it)) {
            ++it;
            continue;
        }
        auto c1 = HexDigit(*(it++));
        if (it == str.end()) return std::nullopt;
        auto c2 = HexDigit(*(it++));
        if (c1 < 0 || c2 < 0) return std::nullopt;
        vch.push_back(Byte(c1 << 4) | Byte(c2));
    }
    return vch;
}